

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDFace * __thiscall
ON_SubD_FixedSizeHeap::AllocateQuad
          (ON_SubD_FixedSizeHeap *this,uint zero_face_id,uint parent_face_id,ON_SubDEdgePtr *eptrs)

{
  ushort uVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint level;
  ON_SubDComponentBase *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong direction;
  ulong direction_00;
  ulong direction_01;
  ulong direction_02;
  ON_SubDFacePtr OVar9;
  ON_SubDFace *f;
  ON_SubDVertex *vertices [4];
  ON__UINT_PTR edgedirs [4];
  ON_SubDEdge *edges [4];
  ON_SubDEdgePtr *eptrs_local;
  uint parent_face_id_local;
  uint zero_face_id_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (eptrs == (ON_SubDEdgePtr *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    this_00 = (ON_SubDComponentBase *)(eptrs->m_ptr & 0xfffffffffffffff8);
    uVar6 = eptrs[1].m_ptr & 0xfffffffffffffff8;
    uVar7 = eptrs[2].m_ptr & 0xfffffffffffffff8;
    uVar8 = eptrs[3].m_ptr & 0xfffffffffffffff8;
    if ((this_00 == (ON_SubDComponentBase *)0x0) || (1 < (ushort)this_00[1].m_group_id)) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
    else if ((uVar6 == 0) || (1 < *(ushort *)(uVar6 + 100))) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
    else if ((uVar7 == 0) || (1 < *(ushort *)(uVar7 + 100))) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
    else if ((uVar8 == 0) || (1 < *(ushort *)(uVar8 + 100))) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
    else {
      direction = eptrs->m_ptr & 1;
      direction_00 = eptrs[1].m_ptr & 1;
      direction_01 = eptrs[2].m_ptr & 1;
      direction_02 = eptrs[3].m_ptr & 1;
      dVar2 = this_00[1].m_saved_subd_point1[direction + 3];
      lVar3 = *(long *)(uVar6 + 0x80 + direction_00 * 8);
      lVar4 = *(long *)(uVar7 + 0x80 + direction_01 * 8);
      lVar5 = *(long *)(uVar8 + 0x80 + direction_02 * 8);
      if ((((dVar2 == 0.0) || (*(long *)((long)dVar2 + 0x78) == 0)) ||
          (*(ushort *)((long)dVar2 + 0x6e) <= *(ushort *)((long)dVar2 + 0x6a))) ||
         (dVar2 != *(double *)(uVar8 + 0x80 + (1 - direction_02) * 8))) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else if (((lVar3 == 0) || (*(long *)(lVar3 + 0x78) == 0)) ||
              ((*(ushort *)(lVar3 + 0x6e) <= *(ushort *)(lVar3 + 0x6a) ||
               (lVar3 != *(long *)((long)this_00 + (1 - direction) * 8 + 0x80))))) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else if ((((lVar4 == 0) || (*(long *)(lVar4 + 0x78) == 0)) ||
               (*(ushort *)(lVar4 + 0x6e) <= *(ushort *)(lVar4 + 0x6a))) ||
              (lVar4 != *(long *)(uVar6 + 0x80 + (1 - direction_00) * 8))) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else if ((((lVar5 == 0) || (*(long *)(lVar5 + 0x78) == 0)) ||
               (*(ushort *)(lVar5 + 0x6e) <= *(ushort *)(lVar5 + 0x6a))) ||
              (lVar5 != *(long *)(uVar7 + 0x80 + (1 - direction_01) * 8))) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else {
        this_local = (ON_SubD_FixedSizeHeap *)
                     Internal_AllocateFace(this,zero_face_id,parent_face_id);
        if ((ON_SubDFace *)this_local == (ON_SubDFace *)0x0) {
          ON_SubDIncrementErrorCount();
          this_local = (ON_SubD_FixedSizeHeap *)0x0;
        }
        else {
          ((ON_SubDFace *)this_local)->m_edge_count = 4;
          ((ON_SubDFace *)this_local)->m_edge4[0].m_ptr = eptrs->m_ptr;
          ((ON_SubDFace *)this_local)->m_edge4[1].m_ptr = eptrs[1].m_ptr;
          ((ON_SubDFace *)this_local)->m_edge4[2].m_ptr = eptrs[2].m_ptr;
          ((ON_SubDFace *)this_local)->m_edge4[3].m_ptr = eptrs[3].m_ptr;
          OVar9 = ON_SubDFacePtr::Create((ON_SubDFace *)this_local,direction);
          uVar1 = (ushort)this_00[1].m_group_id;
          *(ushort *)&this_00[1].m_group_id = uVar1 + 1;
          this_00[1].m_saved_subd_point1[uVar1] = (double)OVar9.m_ptr;
          OVar9 = ON_SubDFacePtr::Create((ON_SubDFace *)this_local,direction_00);
          uVar1 = *(ushort *)(uVar6 + 100);
          *(ushort *)(uVar6 + 100) = uVar1 + 1;
          *(ON__UINT_PTR *)(uVar6 + 0x68 + (ulong)uVar1 * 8) = OVar9.m_ptr;
          OVar9 = ON_SubDFacePtr::Create((ON_SubDFace *)this_local,direction_01);
          uVar1 = *(ushort *)(uVar7 + 100);
          *(ushort *)(uVar7 + 100) = uVar1 + 1;
          *(ON__UINT_PTR *)(uVar7 + 0x68 + (ulong)uVar1 * 8) = OVar9.m_ptr;
          OVar9 = ON_SubDFacePtr::Create((ON_SubDFace *)this_local,direction_02);
          uVar1 = *(ushort *)(uVar8 + 100);
          *(ushort *)(uVar8 + 100) = uVar1 + 1;
          *(ON__UINT_PTR *)(uVar8 + 0x68 + (ulong)uVar1 * 8) = OVar9.m_ptr;
          uVar1 = *(ushort *)((long)dVar2 + 0x6a);
          *(ushort *)((long)dVar2 + 0x6a) = uVar1 + 1;
          *(ON_SubD_FixedSizeHeap **)(*(long *)((long)dVar2 + 0x78) + (ulong)uVar1 * 8) = this_local
          ;
          uVar1 = *(ushort *)(lVar3 + 0x6a);
          *(ushort *)(lVar3 + 0x6a) = uVar1 + 1;
          *(ON_SubD_FixedSizeHeap **)(*(long *)(lVar3 + 0x78) + (ulong)uVar1 * 8) = this_local;
          uVar1 = *(ushort *)(lVar4 + 0x6a);
          *(ushort *)(lVar4 + 0x6a) = uVar1 + 1;
          *(ON_SubD_FixedSizeHeap **)(*(long *)(lVar4 + 0x78) + (ulong)uVar1 * 8) = this_local;
          uVar1 = *(ushort *)(lVar5 + 0x6a);
          *(ushort *)(lVar5 + 0x6a) = uVar1 + 1;
          *(ON_SubD_FixedSizeHeap **)(*(long *)(lVar5 + 0x78) + (ulong)uVar1 * 8) = this_local;
          level = ON_SubDComponentBase::SubdivisionLevel(this_00);
          ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,level);
        }
      }
    }
  }
  return (ON_SubDFace *)this_local;
}

Assistant:

ON_SubDFace* ON_SubD_FixedSizeHeap::AllocateQuad(
  unsigned int zero_face_id,
  unsigned int parent_face_id,
  const ON_SubDEdgePtr eptrs[4]
  )
{
  if (nullptr == eptrs)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDEdge* edges[4] = {
    ON_SUBD_EDGE_POINTER(eptrs[0].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[1].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[2].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[3].m_ptr)};

  if (nullptr == edges[0] || edges[0]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[1] || edges[1]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[2] || edges[2]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[3] || edges[3]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR edgedirs[4] = {
    ON_SUBD_EDGE_DIRECTION(eptrs[0].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[1].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[2].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[3].m_ptr)};

  ON_SubDVertex* vertices[4] = {
    const_cast<ON_SubDVertex*>(edges[0]->m_vertex[edgedirs[0]]),
    const_cast<ON_SubDVertex*>(edges[1]->m_vertex[edgedirs[1]]),
    const_cast<ON_SubDVertex*>(edges[2]->m_vertex[edgedirs[2]]),
    const_cast<ON_SubDVertex*>(edges[3]->m_vertex[edgedirs[3]]) };

  if (nullptr == vertices[0] || nullptr == vertices[0]->m_faces || vertices[0]->m_face_count >= vertices[0]->m_face_capacity || vertices[0] != edges[3]->m_vertex[1-edgedirs[3]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[1] || nullptr == vertices[1]->m_faces || vertices[1]->m_face_count >= vertices[1]->m_face_capacity || vertices[1] != edges[0]->m_vertex[1-edgedirs[0]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[2] || nullptr == vertices[2]->m_faces || vertices[2]->m_face_count >= vertices[2]->m_face_capacity || vertices[2] != edges[1]->m_vertex[1-edgedirs[1]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[3] || nullptr == vertices[3]->m_faces || vertices[3]->m_face_count >= vertices[3]->m_face_capacity || vertices[3] != edges[2]->m_vertex[1-edgedirs[2]])
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDFace* f = Internal_AllocateFace(zero_face_id,parent_face_id);
  if (nullptr == f)
    return ON_SUBD_RETURN_ERROR(nullptr);

  f->m_edge_count = 4;
  f->m_edge4[0] = eptrs[0];
  f->m_edge4[1] = eptrs[1];
  f->m_edge4[2] = eptrs[2];
  f->m_edge4[3] = eptrs[3];

  edges[0]->m_face2[edges[0]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[0]);
  edges[1]->m_face2[edges[1]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[1]);
  edges[2]->m_face2[edges[2]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[2]);
  edges[3]->m_face2[edges[3]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[3]);

  vertices[0]->m_faces[vertices[0]->m_face_count++] = f;
  //vertices[0]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[1]->m_faces[vertices[1]->m_face_count++] = f;
  //vertices[1]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[2]->m_faces[vertices[2]->m_face_count++] = f;
  //vertices[2]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[3]->m_faces[vertices[3]->m_face_count++] = f;
  //vertices[3]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;

  f->SetSubdivisionLevel( edges[0]->SubdivisionLevel() );

  return f;
}